

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSynth.c
# Opt level: O3

void Gia_ManNormalizeEquivalences(Gia_Man_t *p,int *pReprs)

{
  int iVar1;
  uint uVar2;
  Gia_Rpr_t *pGVar3;
  long lVar4;
  ulong uVar5;
  int *piVar6;
  ulong uVar7;
  uint uVar8;
  
  if (p->pReprs != (Gia_Rpr_t *)0x0) {
    __assert_fail("p->pReprs == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSynth.c"
                  ,0x109,"void Gia_ManNormalizeEquivalences(Gia_Man_t *, int *)");
  }
  if (p->pNexts != (int *)0x0) {
    __assert_fail("p->pNexts == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSynth.c"
                  ,0x10a,"void Gia_ManNormalizeEquivalences(Gia_Man_t *, int *)");
  }
  iVar1 = p->nObjs;
  pGVar3 = (Gia_Rpr_t *)calloc((long)iVar1,4);
  p->pReprs = pGVar3;
  if (0 < (long)iVar1) {
    lVar4 = 0;
    do {
      p->pReprs[lVar4] = (Gia_Rpr_t)((uint)p->pReprs[lVar4] | 0xfffffff);
      lVar4 = lVar4 + 1;
      uVar7 = (ulong)p->nObjs;
    } while (lVar4 < (long)uVar7);
    if (0 < p->nObjs) {
      uVar5 = 0;
      do {
        if (pReprs[uVar5] != -1) {
          uVar7 = uVar5 & 0xffffffff;
          do {
            uVar8 = (uint)uVar7;
            uVar2 = pReprs[(int)uVar8];
            uVar7 = (ulong)uVar2;
            if (uVar2 == 0) {
              uVar8 = 0;
              break;
            }
          } while (uVar2 != 0xffffffff);
          if ((long)uVar5 <= (long)(int)uVar8 && uVar8 != 0xfffffff) {
            __assert_fail("Num == GIA_VOID || Num < Id",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x3a2,"void Gia_ObjSetRepr(Gia_Man_t *, int, int)");
          }
          p->pReprs[uVar5] = (Gia_Rpr_t)((uint)p->pReprs[uVar5] & 0xf0000000 | uVar8 & 0xfffffff);
          uVar7 = (ulong)(uint)p->nObjs;
        }
        uVar5 = uVar5 + 1;
      } while ((long)uVar5 < (long)(int)uVar7);
    }
  }
  piVar6 = Gia_ManDeriveNexts(p);
  p->pNexts = piVar6;
  return;
}

Assistant:

void Gia_ManNormalizeEquivalences( Gia_Man_t * p, int * pReprs )
{
    int i, iRepr;
    assert( p->pReprs == NULL );
    assert( p->pNexts == NULL );
    p->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(p) );
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        Gia_ObjSetRepr( p, i, GIA_VOID );
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
    {
        if ( pReprs[i] == ~0 )
            continue;
        iRepr = Gia_ManFindRepr_rec( pReprs, i );
        Gia_ObjSetRepr( p, i, iRepr );
    }
    p->pNexts = Gia_ManDeriveNexts( p );
}